

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.hpp
# Opt level: O0

void __thiscall pg::SPMSolver::todo_push(SPMSolver *this,int node)

{
  ostream *poVar1;
  int local_14;
  SPMSolver *pSStack_10;
  int node_local;
  SPMSolver *this_local;
  
  if (this->dirty[node] == 0) {
    local_14 = node;
    pSStack_10 = this;
    std::deque<int,_std::allocator<int>_>::push_back(&this->todo,&local_14);
    this->dirty[local_14] = 1;
    if (1 < (this->super_Solver).trace) {
      poVar1 = std::operator<<((this->super_Solver).logger,"push(");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
      poVar1 = std::operator<<(poVar1,")");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void todo_push(int node) {
        if (dirty[node]) return;
        todo.push_back(node);
        dirty[node] = 1;
#ifndef NDEBUG
        if (trace >= 2) logger << "push(" << node << ")" << std::endl;
#endif
    }